

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O2

void CPU::WDC65816::ProcessorStorageConstructor::stack_phd
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchPCThrowaway);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationPerform);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CyclePushNotEmulation);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CyclePushNotEmulation);
  return;
}

Assistant:

static void stack_phd(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(CycleFetchPCThrowaway);	// IO.

		target(OperationPerform);

		target(CyclePushNotEmulation);	// REG high.
		target(CyclePushNotEmulation);	// REG [low].
	}